

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_cookies(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  CURLcode CVar1;
  char *pcVar2;
  Cookie *co;
  char *pcVar3;
  Cookie *pCVar4;
  int iVar5;
  
  CVar1 = CURLE_OK;
  if (((data->set).str[4] == (char *)0x0) ||
     (pcVar2 = Curl_checkheaders(data,"Cookie"), pcVar2 != (char *)0x0)) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (data->set).str[4];
  }
  if (data->cookies != (CookieInfo *)0x0 || pcVar2 != (char *)0x0) {
    CVar1 = CURLE_OK;
    if ((data->cookies == (CookieInfo *)0x0) || (((data->state).field_0x661 & 0x80) == 0)) {
      co = (Cookie *)0x0;
    }
    else {
      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
      pcVar3 = (data->state).aptr.cookiehost;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (conn->host).name;
      }
      co = Curl_cookie_getlist(data->cookies,pcVar3,(data->state).up.path,
                               SUB41((conn->handler->protocol & 2) >> 1,0));
      Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    }
    iVar5 = 0;
    if (co != (Cookie *)0x0) {
      iVar5 = 0;
      pCVar4 = co;
      do {
        if (pCVar4->value != (char *)0x0) {
          pcVar3 = "; ";
          if (iVar5 == 0) {
            CVar1 = Curl_dyn_add(r,"Cookie: ");
            pcVar3 = "";
            if (CVar1 != CURLE_OK) goto LAB_0012597e;
          }
          CVar1 = Curl_dyn_addf(r,"%s%s=%s",pcVar3,pCVar4->name,pCVar4->value);
          if (CVar1 != CURLE_OK) goto LAB_0012597e;
          iVar5 = iVar5 + 1;
        }
        pCVar4 = pCVar4->next;
      } while (pCVar4 != (Cookie *)0x0);
      CVar1 = CURLE_OK;
LAB_0012597e:
      Curl_cookie_freelist(co);
    }
    if ((pcVar2 != (char *)0x0) && (CVar1 == CURLE_OK)) {
      CVar1 = CURLE_OK;
      if (iVar5 == 0) {
        CVar1 = Curl_dyn_add(r,"Cookie: ");
      }
      if (CVar1 == CURLE_OK) {
        pcVar3 = "; ";
        if (iVar5 == 0) {
          pcVar3 = "";
        }
        CVar1 = Curl_dyn_addf(r,"%s%s",pcVar3,pcVar2);
        iVar5 = iVar5 + 1;
      }
    }
    if ((iVar5 != 0) && (CVar1 == CURLE_OK)) {
      CVar1 = Curl_dyn_add(r,"\r\n");
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_cookies(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  char *addcookies = NULL;
  if(data->set.str[STRING_COOKIE] && !Curl_checkheaders(data, "Cookie"))
    addcookies = data->set.str[STRING_COOKIE];

  if(data->cookies || addcookies) {
    struct Cookie *co = NULL; /* no cookies from start */
    int count = 0;

    if(data->cookies && data->state.cookie_engine) {
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      co = Curl_cookie_getlist(data->cookies,
                               data->state.aptr.cookiehost?
                               data->state.aptr.cookiehost:
                               conn->host.name,
                               data->state.up.path,
                               (conn->handler->protocol&CURLPROTO_HTTPS)?
                               TRUE:FALSE);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    if(co) {
      struct Cookie *store = co;
      /* now loop through all cookies that matched */
      while(co) {
        if(co->value) {
          if(0 == count) {
            result = Curl_dyn_add(r, "Cookie: ");
            if(result)
              break;
          }
          result = Curl_dyn_addf(r, "%s%s=%s", count?"; ":"",
                                 co->name, co->value);
          if(result)
            break;
          count++;
        }
        co = co->next; /* next cookie please */
      }
      Curl_cookie_freelist(store);
    }
    if(addcookies && !result) {
      if(!count)
        result = Curl_dyn_add(r, "Cookie: ");
      if(!result) {
        result = Curl_dyn_addf(r, "%s%s", count?"; ":"", addcookies);
        count++;
      }
    }
    if(count && !result)
      result = Curl_dyn_add(r, "\r\n");

    if(result)
      return result;
  }
  return result;
}